

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_sar_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_f1;
  string local_f0;
  opcode local_d0;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"SAR",&local_79);
  make_opcode(&local_58,&local_78,0x601,0xc1,rm64,imm8);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"SAR",&local_f1);
  make_opcode(&local_d0,&local_f0,0x201,0xd3,rm64,cl);
  opcode_table::add_opcode(in_RDI,&local_d0);
  opcode::~opcode(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return in_RDI;
}

Assistant:

opcode_table make_sar_table()
    {
    opcode_table t;
    t.add_opcode(make_opcode("SAR", opcode::rexw | opcode::digit7 | opcode::ib, 0xC1, opcode::rm64, opcode::imm8));
    t.add_opcode(make_opcode("SAR", opcode::rexw | opcode::digit7, 0xD3, opcode::rm64, opcode::cl));
    return t;
    }